

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffered_stream.c
# Opt level: O1

cio_bs_state internal_read_max(cio_buffered_stream *buffered_stream)

{
  cio_read_buffer *read_buffer;
  cio_bs_state cVar1;
  ulong uVar2;
  ulong num_bytes;
  
  read_buffer = buffered_stream->read_buffer;
  if (buffered_stream->last_error != CIO_SUCCESS) {
    cVar1 = call_handler(buffered_stream,buffered_stream->last_error,read_buffer,0);
    return cVar1;
  }
  uVar2 = (long)read_buffer->add_ptr - (long)read_buffer->fetch_ptr;
  if (uVar2 != 0) {
    num_bytes = (buffered_stream->read_info).bytes_to_read;
    if (uVar2 < (buffered_stream->read_info).bytes_to_read) {
      num_bytes = uVar2;
    }
    cVar1 = call_handler(buffered_stream,CIO_SUCCESS,read_buffer,num_bytes);
    return cVar1;
  }
  return CIO_BS_AGAIN;
}

Assistant:

static enum cio_bs_state internal_read_max(struct cio_buffered_stream *buffered_stream)
{
	struct cio_read_buffer *read_buffer = buffered_stream->read_buffer;

	if (cio_unlikely(buffered_stream->last_error != CIO_SUCCESS)) {
		return call_handler(buffered_stream, buffered_stream->last_error, read_buffer, 0);
	}

	size_t available = cio_read_buffer_unread_bytes(read_buffer);
	if (available > 0) {
		size_t bytes_to_read = CIO_MIN(available, buffered_stream->read_info.bytes_to_read);
		return call_handler(buffered_stream, CIO_SUCCESS, read_buffer, bytes_to_read);
	}

	return CIO_BS_AGAIN;
}